

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall TypeTest_IndexedTypePrinter_Test::TestBody(TypeTest_IndexedTypePrinter_Test *this)

{
  pointer *ppHVar1;
  allocator<wasm::HeapType> *paVar2;
  Printed PVar3;
  Printed PVar4;
  Printed PVar5;
  Printed PVar6;
  initializer_list<wasm::HeapType> __l;
  initializer_list<wasm::HeapType> __l_00;
  initializer_list<wasm::Field> __l_01;
  initializer_list<wasm::Field> __l_02;
  bool bVar7;
  HeapType HVar8;
  Type type;
  Type type_00;
  Type type_01;
  char *pcVar9;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference pvVar10;
  char *in_R9;
  Entry EVar11;
  undefined8 in_stack_fffffffffffff628;
  undefined8 in_stack_fffffffffffff630;
  undefined7 in_stack_fffffffffffff638;
  undefined1 in_stack_fffffffffffff63f;
  undefined8 in_stack_fffffffffffff640;
  ostream *poVar12;
  _Invoker_type in_stack_fffffffffffff648;
  allocator<char> *__a;
  AssertHelper local_838;
  Message local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  undefined1 local_808 [8];
  AssertionResult gtest_ar_3;
  Printed local_7f0;
  allocator<char> local_7c1;
  string local_7c0 [32];
  AssertHelper local_7a0;
  Message local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  undefined1 local_770 [8];
  AssertionResult gtest_ar_2;
  Printed local_758;
  allocator<char> local_729;
  string local_728 [32];
  AssertHelper local_708;
  Message local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_1;
  Printed local_6c0;
  allocator<char> local_691;
  string local_690 [32];
  AssertHelper local_670;
  Message local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  undefined1 local_640 [8];
  AssertionResult gtest_ar;
  Printed local_628;
  stringstream local_600 [8];
  stringstream stream;
  ostream local_5f0 [383];
  allocator<char> local_471;
  string local_470;
  undefined1 local_450 [8];
  StructPrinter print;
  string local_3b0;
  undefined1 local_390 [8];
  ArrayPrinter printArrays;
  HeapType local_2f0;
  uintptr_t local_2e8;
  iterator local_2e0;
  size_type local_2d8;
  undefined1 local_2d0 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> arrays;
  HeapType local_2b0;
  uintptr_t local_2a8;
  iterator local_2a0;
  size_type local_298;
  undefined1 local_290 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> structs;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_258;
  AssertHelper local_238;
  Message local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Field local_1e0;
  Array local_1d0;
  Entry local_1c0;
  uintptr_t local_1b0;
  Field local_1a8;
  Array local_198;
  Entry local_188;
  allocator<wasm::Field> local_171;
  uintptr_t local_170;
  Field local_168;
  iterator local_158;
  size_type local_150;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_148;
  Struct local_130;
  Entry local_118;
  allocator<wasm::Field> local_101;
  uintptr_t local_100;
  Field local_f8;
  iterator local_e8;
  size_type local_e0;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_d8;
  Struct local_c0;
  Entry local_a8;
  uintptr_t local_98;
  uintptr_t local_90;
  Type refArrayB;
  Type refArrayA;
  Type refStructB;
  Type refStructA;
  TypeBuilder local_18;
  TypeBuilder builder;
  TypeTest_IndexedTypePrinter_Test *this_local;
  
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)this;
  ::wasm::TypeBuilder::TypeBuilder(&local_18,4);
  ::wasm::TypeBuilder::createRecGroup((ulong)&local_18,0);
  EVar11 = ::wasm::TypeBuilder::operator[](&local_18,0);
  refStructB.id = (uintptr_t)EVar11.builder;
  HVar8 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&refStructB);
  type.id = ::wasm::TypeBuilder::getTempRefType((HeapType)&local_18,(Nullability)HVar8.id,Exact);
  EVar11 = ::wasm::TypeBuilder::operator[](&local_18,1);
  refArrayA.id = (uintptr_t)EVar11.builder;
  HVar8 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&refArrayA);
  type_00.id = ::wasm::TypeBuilder::getTempRefType((HeapType)&local_18,(Nullability)HVar8.id,Exact);
  EVar11 = ::wasm::TypeBuilder::operator[](&local_18,2);
  refArrayB.id = (uintptr_t)EVar11.builder;
  HVar8 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&refArrayB);
  type_01.id = ::wasm::TypeBuilder::getTempRefType((HeapType)&local_18,(Nullability)HVar8.id,Exact);
  local_a8 = ::wasm::TypeBuilder::operator[](&local_18,3);
  local_98 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_a8);
  local_100 = ::wasm::TypeBuilder::getTempRefType((HeapType)&local_18,(Nullability)local_98,Exact);
  local_90 = local_100;
  ::wasm::Field::Field(&local_f8,(Type)local_100,Immutable);
  local_e8 = &local_f8;
  local_e0 = 1;
  std::allocator<wasm::Field>::allocator(&local_101);
  __l_02._M_len = local_e0;
  __l_02._M_array = local_e8;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_d8,__l_02,&local_101);
  ::wasm::Struct::Struct(&local_c0,&local_d8);
  local_118 = ::wasm::TypeBuilder::operator[](&local_18,0);
  ::wasm::TypeBuilder::Entry::operator=(&local_118,&local_c0);
  ::wasm::Struct::~Struct(&local_c0);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_d8);
  std::allocator<wasm::Field>::~allocator(&local_101);
  local_170 = type.id;
  ::wasm::Field::Field(&local_168,type,Immutable);
  local_158 = &local_168;
  local_150 = 1;
  std::allocator<wasm::Field>::allocator(&local_171);
  __l_01._M_len = local_150;
  __l_01._M_array = local_158;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_148,__l_01,&local_171);
  ::wasm::Struct::Struct(&local_130,&local_148);
  local_188 = ::wasm::TypeBuilder::operator[](&local_18,1);
  ::wasm::TypeBuilder::Entry::operator=(&local_188,&local_130);
  ::wasm::Struct::~Struct(&local_130);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_148);
  std::allocator<wasm::Field>::~allocator(&local_171);
  local_1b0 = type_00.id;
  ::wasm::Field::Field(&local_1a8,type_00,Immutable);
  ::wasm::Array::Array(&local_198,local_1a8);
  local_1c0 = ::wasm::TypeBuilder::operator[](&local_18,2);
  ::wasm::TypeBuilder::Entry::operator=(&local_1c0,&local_198);
  ::wasm::Field::Field(&local_1e0,type_01,Immutable);
  ::wasm::Array::Array(&local_1d0,local_1e0);
  EVar11 = ::wasm::TypeBuilder::operator[](&local_18,3);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar11.builder;
  ::wasm::TypeBuilder::Entry::operator=
            ((Entry *)((long)&result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18),&local_1d0);
  ::wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_228,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar7 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar7) {
    testing::Message::Message(&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_258,(internal *)local_228,(AssertionResult *)0x4945b1,"false","true",in_R9);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x61,pcVar9);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  if (bVar7) {
    __x = ::wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &structs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,__x);
    ppHVar1 = &structs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    pvVar10 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)ppHVar1,0);
    local_2b0.id = pvVar10->id;
    pvVar10 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)ppHVar1,1);
    local_2a8 = pvVar10->id;
    local_2a0 = &local_2b0;
    local_298 = 2;
    paVar2 = (allocator<wasm::HeapType> *)
             ((long)&arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<wasm::HeapType>::allocator(paVar2);
    __l_00._M_len = local_298;
    __l_00._M_array = local_2a0;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_290,__l_00,paVar2);
    std::allocator<wasm::HeapType>::~allocator
              ((allocator<wasm::HeapType> *)
               ((long)&arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    ppHVar1 = &structs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    pvVar10 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)ppHVar1,2);
    local_2f0.id = pvVar10->id;
    pvVar10 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)ppHVar1,3);
    local_2e8 = pvVar10->id;
    local_2e0 = &local_2f0;
    local_2d8 = 2;
    paVar2 = (allocator<wasm::HeapType> *)((long)&printArrays.names._M_h._M_single_bucket + 7);
    std::allocator<wasm::HeapType>::allocator(paVar2);
    __l._M_len = local_2d8;
    __l._M_array = local_2e0;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2d0,__l,paVar2);
    std::allocator<wasm::HeapType>::~allocator
              ((allocator<wasm::HeapType> *)((long)&printArrays.names._M_h._M_single_bucket + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,"array",
               (allocator<char> *)((long)&print.names._M_h._M_single_bucket + 7));
    ::wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
    IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
              ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_390,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2d0,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&print.names._M_h._M_single_bucket + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"struct",&local_471);
    ::wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>>
    ::IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
              ((IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>>
                *)local_450,(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_290,
               (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_390,&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator(&local_471);
    std::__cxx11::stringstream::stringstream(local_600);
    pvVar10 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &structs.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )pvVar10->id;
    ::wasm::
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_628,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_450,
                 (HeapType)
                 gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
    PVar3.generateName.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_fffffffffffff630;
    PVar3.typeID = in_stack_fffffffffffff628;
    PVar3.generateName.super__Function_base._M_functor._8_7_ = in_stack_fffffffffffff638;
    PVar3.generateName.super__Function_base._M_functor._M_pod_data[0xf] = in_stack_fffffffffffff63f;
    PVar3.generateName.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffff640;
    PVar3.generateName._M_invoker = in_stack_fffffffffffff648;
    ::wasm::operator<<(local_5f0,PVar3);
    ::wasm::HeapType::Printed::~Printed(&local_628);
    std::__cxx11::stringstream::str();
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[52],_nullptr>
              ((EqHelper *)local_640,"stream.str()",
               "\"(type $struct0 (struct (field (ref null $array1))))\"",&local_660,
               (char (*) [52])"(type $struct0 (struct (field (ref null $array1))))");
    std::__cxx11::string::~string((string *)&local_660);
    bVar7 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
    if (!bVar7) {
      testing::Message::Message(&local_668);
      pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
      testing::internal::AssertHelper::AssertHelper
                (&local_670,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x70,pcVar9);
      testing::internal::AssertHelper::operator=(&local_670,&local_668);
      testing::internal::AssertHelper::~AssertHelper(&local_670);
      testing::Message::~Message(&local_668);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_690,"",&local_691);
    std::__cxx11::stringstream::str((string *)local_600);
    std::__cxx11::string::~string(local_690);
    std::allocator<char>::~allocator(&local_691);
    pvVar10 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &structs.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,1);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )pvVar10->id;
    ::wasm::
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_6c0,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_450,
                 (HeapType)
                 gtest_ar_1.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
    PVar4.generateName.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_fffffffffffff630;
    PVar4.typeID = in_stack_fffffffffffff628;
    PVar4.generateName.super__Function_base._M_functor._8_7_ = in_stack_fffffffffffff638;
    PVar4.generateName.super__Function_base._M_functor._M_pod_data[0xf] = in_stack_fffffffffffff63f;
    PVar4.generateName.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffff640;
    PVar4.generateName._M_invoker = in_stack_fffffffffffff648;
    ::wasm::operator<<(local_5f0,PVar4);
    ::wasm::HeapType::Printed::~Printed(&local_6c0);
    std::__cxx11::stringstream::str();
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[53],_nullptr>
              ((EqHelper *)local_6d8,"stream.str()",
               "\"(type $struct1 (struct (field (ref null $struct0))))\"",&local_6f8,
               (char (*) [53])"(type $struct1 (struct (field (ref null $struct0))))");
    std::__cxx11::string::~string((string *)&local_6f8);
    bVar7 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
    if (!bVar7) {
      testing::Message::Message(&local_700);
      pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
      testing::internal::AssertHelper::AssertHelper
                (&local_708,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x75,pcVar9);
      testing::internal::AssertHelper::operator=(&local_708,&local_700);
      testing::internal::AssertHelper::~AssertHelper(&local_708);
      testing::Message::~Message(&local_700);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_728,"",&local_729);
    std::__cxx11::stringstream::str((string *)local_600);
    std::__cxx11::string::~string(local_728);
    std::allocator<char>::~allocator(&local_729);
    pvVar10 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &structs.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,2);
    gtest_ar_2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )pvVar10->id;
    ::wasm::
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_758,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_450,
                 (HeapType)
                 gtest_ar_2.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
    PVar5.generateName.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_fffffffffffff630;
    PVar5.typeID = in_stack_fffffffffffff628;
    PVar5.generateName.super__Function_base._M_functor._8_7_ = in_stack_fffffffffffff638;
    PVar5.generateName.super__Function_base._M_functor._M_pod_data[0xf] = in_stack_fffffffffffff63f;
    PVar5.generateName.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffff640;
    PVar5.generateName._M_invoker = in_stack_fffffffffffff648;
    ::wasm::operator<<(local_5f0,PVar5);
    ::wasm::HeapType::Printed::~Printed(&local_758);
    std::__cxx11::stringstream::str();
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[43],_nullptr>
              ((EqHelper *)local_770,"stream.str()","\"(type $array0 (array (ref null $struct1)))\""
               ,&local_790,(char (*) [43])"(type $array0 (array (ref null $struct1)))");
    std::__cxx11::string::~string((string *)&local_790);
    bVar7 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
    if (!bVar7) {
      testing::Message::Message(&local_798);
      pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
      testing::internal::AssertHelper::AssertHelper
                (&local_7a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x79,pcVar9);
      testing::internal::AssertHelper::operator=(&local_7a0,&local_798);
      testing::internal::AssertHelper::~AssertHelper(&local_7a0);
      testing::Message::~Message(&local_798);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
    __a = &local_7c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_7c0,"",__a);
    std::__cxx11::stringstream::str((string *)local_600);
    std::__cxx11::string::~string(local_7c0);
    std::allocator<char>::~allocator(&local_7c1);
    poVar12 = local_5f0;
    pvVar10 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &structs.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,3);
    gtest_ar_3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )pvVar10->id;
    ::wasm::
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_7f0,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_450,
                 (HeapType)
                 gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
    PVar6.generateName.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_fffffffffffff630;
    PVar6.typeID = in_stack_fffffffffffff628;
    PVar6.generateName.super__Function_base._M_functor._8_7_ = in_stack_fffffffffffff638;
    PVar6.generateName.super__Function_base._M_functor._M_pod_data[0xf] = in_stack_fffffffffffff63f;
    PVar6.generateName.super__Function_base._M_manager = (_Manager_type)poVar12;
    PVar6.generateName._M_invoker = (_Invoker_type)__a;
    ::wasm::operator<<(poVar12,PVar6);
    ::wasm::HeapType::Printed::~Printed(&local_7f0);
    std::__cxx11::stringstream::str();
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[42],_nullptr>
              ((EqHelper *)local_808,"stream.str()","\"(type $array1 (array (ref null $array0)))\"",
               &local_828,(char (*) [42])"(type $array1 (array (ref null $array0)))");
    std::__cxx11::string::~string((string *)&local_828);
    bVar7 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
    if (!bVar7) {
      testing::Message::Message(&local_830);
      pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_808);
      testing::internal::AssertHelper::AssertHelper
                (&local_838,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x7d,pcVar9);
      testing::internal::AssertHelper::operator=(&local_838,&local_830);
      testing::internal::AssertHelper::~AssertHelper(&local_838);
      testing::Message::~Message(&local_830);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
    std::__cxx11::stringstream::~stringstream(local_600);
    ::wasm::
    IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
    ~IndexedTypeNameGenerator
              ((IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)local_450);
    ::wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::~IndexedTypeNameGenerator
              ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_390);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2d0);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_290);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &structs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  ::wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  ::wasm::TypeBuilder::~TypeBuilder(&local_18);
  return;
}

Assistant:

TEST_F(TypeTest, IndexedTypePrinter) {
  TypeBuilder builder(4);
  builder.createRecGroup(0, 4);

  Type refStructA = builder.getTempRefType(builder[0], Nullable);
  Type refStructB = builder.getTempRefType(builder[1], Nullable);
  Type refArrayA = builder.getTempRefType(builder[2], Nullable);
  Type refArrayB = builder.getTempRefType(builder[3], Nullable);
  builder[0] = Struct({Field(refArrayB, Immutable)});
  builder[1] = Struct({Field(refStructA, Immutable)});
  builder[2] = Array(Field(refStructB, Immutable));
  builder[3] = Array(Field(refArrayA, Immutable));

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  std::vector<HeapType> structs{built[0], built[1]};
  std::vector<HeapType> arrays{built[2], built[3]};

  // Check that IndexedTypePrinters configured with fallbacks work correctly.
  using ArrayPrinter = IndexedTypeNameGenerator<DefaultTypeNameGenerator>;
  ArrayPrinter printArrays(arrays, "array");
  using StructPrinter = IndexedTypeNameGenerator<ArrayPrinter>;
  StructPrinter print(structs, printArrays, "struct");

  std::stringstream stream;
  stream << print(built[0]);
  EXPECT_EQ(stream.str(),
            "(type $struct0 (struct (field (ref null $array1))))");

  stream.str("");
  stream << print(built[1]);
  EXPECT_EQ(stream.str(),
            "(type $struct1 (struct (field (ref null $struct0))))");

  stream.str("");
  stream << print(built[2]);
  EXPECT_EQ(stream.str(), "(type $array0 (array (ref null $struct1)))");

  stream.str("");
  stream << print(built[3]);
  EXPECT_EQ(stream.str(), "(type $array1 (array (ref null $array0)))");
}